

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

PixelBufferAccess *
tcu::getEffectiveDepthStencilAccess
          (PixelBufferAccess *__return_storage_ptr__,PixelBufferAccess *baseAccess,
          DepthStencilMode mode)

{
  DepthStencilMode mode_local;
  PixelBufferAccess *baseAccess_local;
  
  toSamplerAccess<tcu::PixelBufferAccess>(__return_storage_ptr__,baseAccess,mode);
  return __return_storage_ptr__;
}

Assistant:

PixelBufferAccess getEffectiveDepthStencilAccess (const PixelBufferAccess& baseAccess, Sampler::DepthStencilMode mode)
{
	return toSamplerAccess<PixelBufferAccess>(baseAccess, mode);
}